

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O1

void rhash_sha3_process_block(uint64_t *hash,uint64_t *block,size_t block_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint64_t uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint64_t uVar26;
  ulong uVar27;
  uint64_t uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_88;
  
  local_100 = *hash ^ *block;
  *hash = local_100;
  local_a8 = hash[1] ^ block[1];
  hash[1] = local_a8;
  local_98 = hash[2] ^ block[2];
  hash[2] = local_98;
  local_b8 = hash[3] ^ block[3];
  hash[3] = local_b8;
  local_b0 = hash[4] ^ block[4];
  hash[4] = local_b0;
  local_c8 = hash[5] ^ block[5];
  hash[5] = local_c8;
  uVar29 = hash[6] ^ block[6];
  hash[6] = uVar29;
  uVar11 = hash[7] ^ block[7];
  hash[7] = uVar11;
  uVar2 = hash[8] ^ block[8];
  hash[8] = uVar2;
  if (0x48 < block_size) {
    hash[9] = hash[9] ^ block[9];
    hash[10] = hash[10] ^ block[10];
    hash[0xb] = hash[0xb] ^ block[0xb];
    hash[0xc] = hash[0xc] ^ block[0xc];
    if (0x68 < block_size) {
      hash[0xd] = hash[0xd] ^ block[0xd];
      hash[0xe] = hash[0xe] ^ block[0xe];
      hash[0xf] = hash[0xf] ^ block[0xf];
      hash[0x10] = hash[0x10] ^ block[0x10];
      if (0x88 < block_size) {
        hash[0x11] = hash[0x11] ^ block[0x11];
      }
    }
  }
  local_108 = hash[0xb];
  uVar6 = hash[0x10];
  local_c0 = hash[0x15];
  local_a0 = hash[9];
  uVar1 = hash[10];
  uVar18 = hash[0xe];
  uVar22 = hash[0x13];
  local_110 = hash[0x18];
  uVar28 = hash[0xc];
  local_f8 = hash[0x11];
  local_d8 = hash[0x16];
  uVar15 = hash[0xf];
  local_88 = hash[0x14];
  uVar26 = hash[0xd];
  local_e0 = hash[0x12];
  local_d0 = hash[0x17];
  lVar7 = 0;
  do {
    uVar3 = local_108 ^ uVar6 ^ uVar29 ^ local_a8 ^ local_c0;
    uVar21 = uVar28 ^ local_f8 ^ uVar11 ^ local_98 ^ local_d8;
    uVar8 = local_b0 ^ local_a0 ^ uVar18 ^ uVar22 ^ local_110 ^
            (uVar3 << 1 | (ulong)((long)uVar3 < 0));
    uVar4 = local_100 ^ local_c8 ^ uVar1 ^ uVar15 ^ local_88 ^
            (uVar21 << 1 | (ulong)((long)uVar21 < 0));
    uVar3 = uVar26 ^ local_e0 ^ uVar2 ^ local_b8 ^ local_d0;
    uVar13 = uVar29 ^ local_a8 ^ local_108 ^ uVar6 ^ local_c0 ^
             (uVar3 << 1 | (ulong)((long)uVar3 < 0));
    uVar21 = uVar18 ^ uVar22 ^ local_b0 ^ local_a0 ^ local_110;
    uVar3 = uVar1 ^ uVar15 ^ local_100 ^ local_c8 ^ local_88;
    uVar23 = uVar11 ^ local_98 ^ uVar28 ^ local_f8 ^ local_d8 ^
             (uVar21 << 1 | (ulong)((long)uVar21 < 0));
    uVar19 = uVar2 ^ local_b8 ^ uVar26 ^ local_e0 ^ local_d0 ^
             (uVar3 << 1 | (ulong)((long)uVar3 < 0));
    local_100 = local_100 ^ uVar8;
    uVar3 = local_c8 ^ uVar8;
    uVar9 = uVar8 ^ local_88;
    uVar10 = local_a8 ^ uVar4;
    uVar21 = uVar11 ^ uVar13;
    uVar14 = uVar13 ^ local_d8;
    uVar24 = uVar23 ^ local_d0;
    uVar16 = local_b0 ^ uVar19;
    uVar5 = (local_98 ^ uVar13) << 0x3e | (local_98 ^ uVar13) >> 2;
    uVar25 = (local_b8 ^ uVar23) << 0x1c | (local_b8 ^ uVar23) >> 0x24;
    uVar30 = (uVar29 ^ uVar4) << 0x2c | (uVar29 ^ uVar4) >> 0x14;
    uVar27 = (uVar28 ^ uVar13) << 0x2b | (uVar28 ^ uVar13) >> 0x15;
    local_b8 = (local_e0 ^ uVar23) << 0x15 | (local_e0 ^ uVar23) >> 0x2b;
    local_b0 = (uVar19 ^ local_110) << 0xe | (uVar19 ^ local_110) >> 0x32;
    local_98 = ~local_b8 & local_b0 ^ uVar27;
    local_a8 = ~uVar27 & local_b8 ^ uVar30;
    uVar12 = (uVar2 ^ uVar23) << 0x37 | (uVar2 ^ uVar23) >> 9;
    uVar11 = (uVar18 ^ uVar19) << 0x27 | (uVar18 ^ uVar19) >> 0x19;
    uVar15 = (uVar15 ^ uVar8) << 0x29 | (uVar15 ^ uVar8) >> 0x17;
    uVar20 = (uVar4 ^ local_c0) << 2 | (uVar4 ^ local_c0) >> 0x3e;
    local_88 = ~uVar12 & uVar11 ^ uVar5;
    local_d8 = ~uVar15 & uVar20 ^ uVar11;
    local_c0 = ~uVar11 & uVar15 ^ uVar12;
    uVar17 = (local_a0 ^ uVar19) << 0x14 | (local_a0 ^ uVar19) >> 0x2c;
    uVar11 = (uVar1 ^ uVar8) << 3 | (uVar1 ^ uVar8) >> 0x3d;
    uVar2 = (uVar6 ^ uVar4) << 0x2d | (uVar6 ^ uVar4) >> 0x13;
    uVar6 = uVar14 << 0x3d | uVar14 >> 3;
    local_c8 = ~uVar17 & uVar11 ^ uVar25;
    uVar29 = ~uVar11 & uVar2 ^ uVar17;
    local_b8 = ~local_b0 & local_100 ^ local_b8;
    local_b0 = ~local_100 & uVar30 ^ local_b0;
    uVar11 = ~uVar2 & uVar6 ^ uVar11;
    uVar2 = ~uVar6 & uVar25 ^ uVar2;
    local_a0 = uVar17 & ~uVar25 ^ uVar6;
    local_d0 = ~uVar20 & uVar5 ^ uVar15;
    uVar8 = uVar16 << 0x1b | uVar16 >> 0x25;
    uVar14 = uVar3 << 0x24 | uVar3 >> 0x1c;
    uVar6 = (local_108 ^ uVar4) << 10 | (local_108 ^ uVar4) >> 0x36;
    uVar13 = (local_f8 ^ uVar13) << 0xf | (local_f8 ^ uVar13) >> 0x31;
    uVar16 = uVar24 << 0x38 | uVar24 >> 8;
    local_e0 = ~uVar16 & uVar8 ^ uVar13;
    local_f8 = ~uVar13 & uVar16 ^ uVar6;
    uVar4 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    uVar15 = uVar21 << 6 | uVar21 >> 0x3a;
    uVar3 = (uVar26 ^ uVar23) << 0x19 | (uVar26 ^ uVar23) >> 0x27;
    uVar10 = (uVar22 ^ uVar19) << 8 | (uVar22 ^ uVar19) >> 0x38;
    uVar21 = uVar9 << 0x12 | uVar9 >> 0x2e;
    uVar28 = ~uVar10 & uVar21 ^ uVar3;
    uVar26 = ~uVar21 & uVar4 ^ uVar10;
    uVar1 = ~uVar15 & uVar3 ^ uVar4;
    local_108 = ~uVar3 & uVar10 ^ uVar15;
    uVar18 = ~uVar4 & uVar15 ^ uVar21;
    uVar15 = ~uVar14 & uVar6 ^ uVar8;
    uVar6 = ~uVar6 & uVar13 ^ uVar14;
    uVar22 = ~uVar8 & uVar14 ^ uVar16;
    local_110 = ~uVar5 & uVar12 ^ uVar20;
    local_100 = ~uVar30 & uVar27 ^ *(ulong *)((long)keccak_round_constants + lVar7) ^ local_100;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0xc0);
  hash[1] = local_a8;
  hash[6] = uVar29;
  hash[0xb] = local_108;
  hash[0x10] = uVar6;
  hash[0x15] = local_c0;
  hash[4] = local_b0;
  hash[9] = local_a0;
  hash[0xe] = uVar18;
  hash[0x13] = uVar22;
  hash[0x18] = local_110;
  hash[2] = local_98;
  hash[7] = uVar11;
  hash[0xc] = uVar28;
  hash[0x11] = local_f8;
  hash[0x16] = local_d8;
  *hash = local_100;
  hash[5] = local_c8;
  hash[10] = uVar1;
  hash[0xf] = uVar15;
  hash[0x14] = local_88;
  hash[3] = local_b8;
  hash[8] = uVar2;
  hash[0xd] = uVar26;
  hash[0x12] = local_e0;
  hash[0x17] = local_d0;
  return;
}

Assistant:

static void rhash_sha3_process_block(uint64_t hash[25], const uint64_t* block, size_t block_size)
{
	/* expanded loop */
	hash[ 0] ^= le2me_64(block[ 0]);
	hash[ 1] ^= le2me_64(block[ 1]);
	hash[ 2] ^= le2me_64(block[ 2]);
	hash[ 3] ^= le2me_64(block[ 3]);
	hash[ 4] ^= le2me_64(block[ 4]);
	hash[ 5] ^= le2me_64(block[ 5]);
	hash[ 6] ^= le2me_64(block[ 6]);
	hash[ 7] ^= le2me_64(block[ 7]);
	hash[ 8] ^= le2me_64(block[ 8]);
	/* if not sha3-512 */
	if (block_size > 72) {
		hash[ 9] ^= le2me_64(block[ 9]);
		hash[10] ^= le2me_64(block[10]);
		hash[11] ^= le2me_64(block[11]);
		hash[12] ^= le2me_64(block[12]);
		/* if not sha3-384 */
		if (block_size > 104) {
			hash[13] ^= le2me_64(block[13]);
			hash[14] ^= le2me_64(block[14]);
			hash[15] ^= le2me_64(block[15]);
			hash[16] ^= le2me_64(block[16]);
			/* if not sha3-256 */
			if (block_size > 136) {
				hash[17] ^= le2me_64(block[17]);
#ifdef FULL_SHA3_FAMILY_SUPPORT
				/* if not sha3-224 */
				if (block_size > 144) {
					hash[18] ^= le2me_64(block[18]);
					hash[19] ^= le2me_64(block[19]);
					hash[20] ^= le2me_64(block[20]);
					hash[21] ^= le2me_64(block[21]);
					hash[22] ^= le2me_64(block[22]);
					hash[23] ^= le2me_64(block[23]);
					hash[24] ^= le2me_64(block[24]);
				}
#endif
			}
		}
	}
	/* make a permutation of the hash */
	rhash_sha3_permutation(hash);
}